

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizeSelect(OptimizeInstructions *this,Select *curr)

{
  size_t *__return_storage_ptr__;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
  matcher;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
  matcher_00;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  matcher_01;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  matcher_02;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  matcher_03;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  matcher_04;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
  matcher_05;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  matcher_06;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
  matcher_07;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  matcher_08;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  matcher_09;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  matcher_10;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  matcher_11;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
  matcher_12;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
  matcher_13;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  matcher_14;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  matcher_15;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  matcher_16;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  matcher_17;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  matcher_18;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  matcher_19;
  Builder BVar1;
  bool bVar2;
  bool bVar3;
  Index IVar4;
  Id IVar5;
  uint uVar6;
  BinaryOp op;
  Module *wasm;
  Expression *pEVar7;
  Unary *pUVar8;
  Const *pCVar9;
  OptimizeInstructions *pOVar10;
  Drop *pDVar11;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *pMVar12;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *s2;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  *pMVar13;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *s2_00;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *pMVar14;
  Match *pMVar15;
  Expression **ppEVar16;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *this_00;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *in_R8;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  *s3;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *in_R9;
  bool local_12e9;
  bool local_12d9;
  bool local_12b1;
  OptimizeInstructions *local_1278;
  bool local_1259;
  Expression *local_1258;
  bool local_1239;
  OptimizeInstructions *local_1230;
  bool local_1219;
  bool local_1201;
  bool local_11f1;
  undefined1 local_11c8 [8];
  EffectAnalyzer condition;
  EffectAnalyzer value;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_ed8;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_ec8 [2];
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_eb8;
  undefined1 local_e88 [8];
  Expression *c_4;
  Expression *ifFalse_2;
  Expression *ifTrue_2;
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_e60;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_e40;
  Select *local_e30 [2];
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_e20;
  undefined1 local_df0 [8];
  Expression *c_3;
  Expression *ifFalse_1;
  Expression *ifTrue_1;
  Select *s;
  Export *local_dc8;
  Literal local_dc0;
  Export *local_d98;
  Literal local_d90;
  Export *local_d78;
  _Head_base<0UL,_wasm::Export_*,_false> local_d70;
  Type type;
  Const *c_2;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_d18 [2];
  undefined1 local_d08 [112];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_c98;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
  local_c50;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_c20;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_bd8 [2];
  undefined1 local_bc8 [112];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_b58;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
  local_b10;
  Expression *local_ae0;
  Binary *bin;
  undefined1 local_ac8 [16];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_ab8;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_a70;
  undefined1 local_a40 [16];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_a30;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_9e8 [2];
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_9d8;
  undefined1 local_9a8 [8];
  Expression *y_1;
  Expression *x_1;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_990;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_910;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_8c8;
  Const *local_880;
  Const *c_1;
  Binary *pBStack_870;
  BinaryOp inv;
  Binary *binary;
  undefined1 local_860 [88];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_808;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_7c0;
  undefined1 local_790 [88];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_738;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_6f0;
  byte local_6b9;
  undefined1 auStack_6b8 [7];
  bool reversed;
  Expression *c;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_668 [2];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  local_658;
  undefined1 local_630 [16];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_620;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
  local_5d8;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_5a8 [2];
  undefined1 local_598 [32];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_578;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_530 [2];
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_520;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_4f0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_4a8 [2];
  undefined1 local_498 [40];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_470;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_428 [2];
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
  local_418;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_3e8 [2];
  Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_3d8;
  undefined1 local_3b8 [16];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  local_3a8;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_360;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_330;
  undefined1 local_320 [16];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
  local_310;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_2d0;
  undefined1 local_2a0 [16];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
  local_290;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_250 [2];
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  local_240;
  undefined1 local_210 [8];
  Expression *y;
  Expression *x;
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> local_1c0;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_1a8 [2];
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_198;
  int local_164;
  undefined1 local_160 [4];
  int32_t cond;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_120;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_110 [2];
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
  local_100;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
  local_d0;
  undefined1 local_90 [16];
  Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> local_80;
  Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
  local_68;
  undefined1 local_38 [8];
  Expression *ifFalse;
  Expression *ifTrue;
  Builder builder;
  Select *curr_local;
  OptimizeInstructions *this_local;
  
  builder.wasm = (Module *)curr;
  wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
         getModule(&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                    ).
                    super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    .
                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  );
  Builder::Builder((Builder *)&ifTrue,wasm);
  pEVar7 = optimizeBoolean(this,(Expression *)
                                ((builder.wasm)->functions).
                                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
  BVar1 = builder;
  ((builder.wasm)->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar7;
  pOVar10 = this;
  pure((Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)(local_90 + 0x10),this,
       &ifFalse);
  local_90._0_8_ =
       Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_38,
                  (Expression **)pOVar10);
  Match::i32(&local_d0,0);
  pMVar15 = (Match *)(local_90 + 0x10);
  Match::
  select<wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>>
            (&local_68,pMVar15,
             (Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)local_90,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_d0,
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
              *)in_R8);
  matcher._8_8_ = local_68._8_8_;
  matcher.binder = local_68.binder;
  matcher.submatchers.curr = local_68.submatchers.curr;
  matcher.submatchers.next.curr = local_68.submatchers.next.curr;
  matcher.submatchers.next.next.curr = local_68.submatchers.next.next.curr;
  matcher.submatchers.next.next._8_8_ = local_68.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>&>>
                    ((Expression *)BVar1.wasm,matcher);
  BVar1 = builder;
  if (bVar2) {
    return (Expression *)local_38;
  }
  local_110[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&ifFalse
                            ,(Expression **)pMVar15);
  local_120.binder =
       (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
       Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_38,
                  (Expression **)pMVar15);
  Match::i32((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
              *)local_160,0);
  pMVar15 = (Match *)local_110;
  Match::
  select<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>>
            (&local_100,pMVar15,&local_120,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_160,
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
              *)in_R8);
  matcher_00._8_8_ = local_100._8_8_;
  matcher_00.binder = local_100.binder;
  matcher_00.submatchers.curr = local_100.submatchers.curr;
  matcher_00.submatchers.next.curr = local_100.submatchers.next.curr;
  matcher_00.submatchers.next.next.curr = local_100.submatchers.next.next.curr;
  matcher_00.submatchers.next.next._8_8_ = local_100.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>&>>
                    ((Expression *)BVar1.wasm,matcher_00);
  BVar1 = builder;
  if (bVar2) {
    pDVar11 = Builder::makeDrop((Builder *)&ifTrue,ifFalse);
    pOVar10 = (OptimizeInstructions *)
              Builder::makeSequence((Builder *)&ifTrue,(Expression *)pDVar11,(Expression *)local_38)
    ;
    return (Expression *)pOVar10;
  }
  local_1a8[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&ifFalse
                            ,(Expression **)pMVar15);
  pure(&local_1c0,this,(Expression **)local_38);
  Match::i32((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
              *)&x,&local_164);
  pMVar15 = (Match *)local_1a8;
  Match::
  select<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>>>>>
            (&local_198,pMVar15,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_1c0,
             (Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_> *)&x,
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
              *)in_R8);
  matcher_01._8_8_ = local_198._8_8_;
  matcher_01.binder = local_198.binder;
  matcher_01.submatchers.curr = local_198.submatchers.curr;
  matcher_01.submatchers.next.curr = local_198.submatchers.next.curr;
  matcher_01.submatchers.next.next.curr = local_198.submatchers.next.next.curr;
  matcher_01.submatchers.next.next._8_8_ = local_198.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>>>>&>>
                    ((Expression *)BVar1.wasm,matcher_01);
  BVar1 = builder;
  if (bVar2) {
    if (local_164 == 0) {
      __assert_fail("cond != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0xa1f,"Expression *wasm::OptimizeInstructions::optimizeSelect(Select *)");
    }
    return ifFalse;
  }
  local_250[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y,
                            (Expression **)pMVar15);
  ppEVar16 = (Expression **)0x0;
  Match::i32((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
              *)(local_2a0 + 0x10),0);
  local_2a0._0_8_ =
       Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_210,ppEVar16
                 );
  Match::
  select<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
            (&local_240,(Match *)local_250,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)(local_2a0 + 0x10),
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
              *)local_2a0,(Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)in_R8);
  matcher_02._8_8_ = local_240._8_8_;
  matcher_02.binder = local_240.binder;
  matcher_02.submatchers.curr = local_240.submatchers.curr;
  matcher_02.submatchers.next.curr = local_240.submatchers.next.curr;
  matcher_02.submatchers.next.next.curr = local_240.submatchers.next.next.curr;
  matcher_02.submatchers.next.next._8_8_ = local_240.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                    ((Expression *)BVar1.wasm,matcher_02);
  local_11f1 = false;
  if (bVar2) {
    local_11f1 = areConsecutiveInputsEqualAndFoldable(this,y,(Expression *)local_210);
  }
  BVar1.wasm = builder.wasm;
  if (local_11f1 != false) {
    return (Expression *)
           (OptimizeInstructions *)
           ((builder.wasm)->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  ppEVar16 = (Expression **)0x0;
  Match::i32((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
              *)(local_320 + 0x10),0);
  local_320._0_8_ =
       Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y,ppEVar16);
  local_330.binder =
       (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
       Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_210,ppEVar16
                 );
  pMVar12 = &local_330;
  Match::
  select<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
            (&local_2d0,(Match *)(local_320 + 0x10),
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
              *)local_320,pMVar12,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)in_R8);
  matcher_03._8_8_ = local_2d0._8_8_;
  matcher_03.binder = local_2d0.binder;
  matcher_03.submatchers.curr = local_2d0.submatchers.curr;
  matcher_03.submatchers.next.curr = local_2d0.submatchers.next.curr;
  matcher_03.submatchers.next.next.curr = local_2d0.submatchers.next.next.curr;
  matcher_03.submatchers.next.next._8_8_ = local_2d0.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                    ((Expression *)BVar1.wasm,matcher_03);
  pMVar12 = (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
            CONCAT71((int7)((ulong)pMVar12 >> 8),bVar2);
  local_1201 = false;
  if (bVar2) {
    local_1201 = areConsecutiveInputsEqualAndFoldable(this,y,(Expression *)local_210);
  }
  BVar1.wasm = builder.wasm;
  if (local_1201 != false) {
    pDVar11 = Builder::makeDrop((Builder *)&ifTrue,y);
    pOVar10 = (OptimizeInstructions *)
              Builder::makeSequence
                        ((Builder *)&ifTrue,(Expression *)pDVar11,
                         (Expression *)
                         ((builder.wasm)->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return (Expression *)pOVar10;
  }
  ppEVar16 = (Expression **)0x0;
  Match::i64((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              *)(local_3b8 + 0x10),0);
  local_3b8._0_8_ =
       Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y,ppEVar16);
  local_3e8[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                            local_210,ppEVar16);
  Match::unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
            (&local_3d8,(Match *)0x15,(UnaryOp)local_3e8,pMVar12);
  pMVar15 = (Match *)(local_3b8 + 0x10);
  pMVar13 = &local_3d8;
  Match::
  select<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
            (&local_360,pMVar15,
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              *)local_3b8,(Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar13,
             (Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              *)in_R8);
  matcher_04._8_8_ = local_360._8_8_;
  matcher_04.binder = local_360.binder;
  matcher_04.submatchers.curr = local_360.submatchers.curr;
  matcher_04.submatchers.next.curr = local_360.submatchers.next.curr;
  matcher_04.submatchers.next.next.curr = local_360.submatchers.next.next.curr;
  matcher_04.submatchers.next.next._8_8_ = local_360.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&>>
                    ((Expression *)BVar1.wasm,matcher_04);
  BVar1 = builder;
  if (bVar2) {
LAB_0190083c:
    pEVar7 = y;
    local_1219 = areConsecutiveInputsEqualAndFoldable(this,y,(Expression *)local_210);
  }
  else {
    local_428[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y,
                              (Expression **)pMVar15);
    ppEVar16 = (Expression **)0x0;
    Match::i64((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                *)(local_498 + 0x28),0);
    local_4a8[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                              local_210,ppEVar16);
    Match::i64(&local_4f0,0);
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
              ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                *)local_498,(Match *)0x29,(BinaryOp)local_4a8,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_4f0,in_R8);
    pEVar7 = (Expression *)local_428;
    s2 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)local_498;
    Match::
    select<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
              (&local_418,(Match *)pEVar7,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)(local_498 + 0x28),s2
               ,(Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                 *)in_R8);
    matcher_05._8_8_ = local_418._8_8_;
    matcher_05.binder = local_418.binder;
    matcher_05.submatchers.curr = local_418.submatchers.curr;
    matcher_05.submatchers.next.curr = local_418.submatchers.next.curr;
    matcher_05.submatchers.next.next.curr = local_418.submatchers.next.next.curr;
    matcher_05.submatchers.next.next._8_8_ = local_418.submatchers.next.next._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>&>>
                      ((Expression *)BVar1.wasm,matcher_05);
    pMVar13 = (Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
               *)CONCAT71((int7)((ulong)s2 >> 8),bVar2);
    local_1219 = false;
    if (bVar2) goto LAB_0190083c;
  }
  BVar1.wasm = builder.wasm;
  if (local_1219 != false) {
    bVar2 = Expression::is<wasm::Unary>
                      ((Expression *)
                       ((builder.wasm)->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar2) {
      local_1230 = (OptimizeInstructions *)
                   ((builder.wasm)->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      local_1230 = (OptimizeInstructions *)
                   ((builder.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    return (Expression *)local_1230;
  }
  local_530[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y,
                            (Expression **)pEVar7);
  ppEVar16 = (Expression **)0x0;
  Match::i64((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              *)(local_598 + 0x20),0);
  local_5a8[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                            local_210,ppEVar16);
  Match::unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
            ((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              *)local_598,(Match *)0x15,(UnaryOp)local_5a8,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar13);
  Match::
  select<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
            (&local_520,(Match *)local_530,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)(local_598 + 0x20),
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              *)local_598,
             (Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              *)in_R8);
  matcher_06._8_8_ = local_520._8_8_;
  matcher_06.binder = local_520.binder;
  matcher_06.submatchers.curr = local_520.submatchers.curr;
  matcher_06.submatchers.next.curr = local_520.submatchers.next.curr;
  matcher_06.submatchers.next.next.curr = local_520.submatchers.next.next.curr;
  matcher_06.submatchers.next.next._8_8_ = local_520.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&>>
                    ((Expression *)BVar1.wasm,matcher_06);
  BVar1 = builder;
  if (bVar2) {
LAB_01900a27:
    local_1239 = areConsecutiveInputsEqualAndFoldable(this,y,(Expression *)local_210);
  }
  else {
    ppEVar16 = (Expression **)0x0;
    Match::i64((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                *)(local_630 + 0x10),0);
    local_630._0_8_ =
         Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y,ppEVar16);
    local_668[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                              local_210,ppEVar16);
    Match::i64((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                *)&c,0);
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
              (&local_658,(Match *)0x29,(BinaryOp)local_668,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&c,in_R8);
    Match::
    select<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
              (&local_5d8,(Match *)(local_630 + 0x10),
               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                *)local_630,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_658,
               (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                *)in_R8);
    matcher_07._8_8_ = local_5d8._8_8_;
    matcher_07.binder = local_5d8.binder;
    matcher_07.submatchers.curr = local_5d8.submatchers.curr;
    matcher_07.submatchers.next.curr = local_5d8.submatchers.next.curr;
    matcher_07.submatchers.next.next.curr = local_5d8.submatchers.next.next.curr;
    matcher_07.submatchers.next.next._8_8_ = local_5d8.submatchers.next.next._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>&>>
                      ((Expression *)BVar1.wasm,matcher_07);
    local_1239 = false;
    if (bVar2) goto LAB_01900a27;
  }
  BVar1.wasm = builder.wasm;
  if (local_1239 != false) {
    pDVar11 = Builder::makeDrop((Builder *)&ifTrue,y);
    bVar2 = Expression::is<wasm::Unary>
                      ((Expression *)
                       ((builder.wasm)->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar2) {
      local_1258 = (Expression *)
                   ((builder.wasm)->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      local_1258 = (Expression *)
                   ((builder.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    pOVar10 = (OptimizeInstructions *)
              Builder::makeSequence((Builder *)&ifTrue,(Expression *)pDVar11,local_1258);
    return (Expression *)pOVar10;
  }
  Match::ival(&local_738,0);
  ppEVar16 = (Expression **)0x1;
  Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
               *)(local_790 + 0x10),1);
  local_790._0_8_ =
       Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)auStack_6b8,
                  ppEVar16);
  Match::
  select<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
            (&local_6f0,(Match *)&local_738,
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              *)(local_790 + 0x10),
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              *)local_790,(Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)in_R8);
  matcher_08._8_8_ = local_6f0._8_8_;
  matcher_08.binder = local_6f0.binder;
  matcher_08.submatchers.curr = local_6f0.submatchers.curr;
  matcher_08.submatchers.next.curr = local_6f0.submatchers.next.curr;
  matcher_08.submatchers.next.next.curr = local_6f0.submatchers.next.next.curr;
  matcher_08.submatchers.next.next._8_8_ = local_6f0.submatchers.next.next._8_8_;
  local_6b9 = Match::
              matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                        ((Expression *)BVar1.wasm,matcher_08);
  BVar1 = builder;
  local_1259 = true;
  if (!(bool)local_6b9) {
    Match::ival(&local_808,1);
    ppEVar16 = (Expression **)0x0;
    Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                 *)(local_860 + 0x10),0);
    local_860._0_8_ =
         Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)auStack_6b8,
                    ppEVar16);
    Match::
    select<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
              (&local_7c0,(Match *)&local_808,
               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                *)(local_860 + 0x10),
               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                *)local_860,(Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)in_R8);
    matcher_09._8_8_ = local_7c0._8_8_;
    matcher_09.binder = local_7c0.binder;
    matcher_09.submatchers.curr = local_7c0.submatchers.curr;
    matcher_09.submatchers.next.curr = local_7c0.submatchers.next.curr;
    matcher_09.submatchers.next.next.curr = local_7c0.submatchers.next.next.curr;
    matcher_09.submatchers.next.next._8_8_ = local_7c0.submatchers.next.next._8_8_;
    local_1259 = Match::
                 matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                           ((Expression *)BVar1.wasm,matcher_09);
  }
  if (local_1259 != false) {
    if ((local_6b9 & 1) != 0) {
      pUVar8 = Builder::makeUnary((Builder *)&ifTrue,EqZInt32,(Expression *)_auStack_6b8);
      _auStack_6b8 = (OptimizeInstructions *)optimizeBoolean(this,(Expression *)pUVar8);
    }
    bVar2 = Properties::emitsBoolean((Expression *)_auStack_6b8);
    if (!bVar2) {
      pUVar8 = Builder::makeUnary((Builder *)&ifTrue,EqZInt32,(Expression *)_auStack_6b8);
      _auStack_6b8 = (OptimizeInstructions *)
                     Builder::makeUnary((Builder *)&ifTrue,EqZInt32,(Expression *)pUVar8);
    }
    binary._4_4_ = 3;
    bVar2 = wasm::Type::operator==
                      ((Type *)&((builder.wasm)->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                       (BasicType *)((long)&binary + 4));
    if (bVar2) {
      local_1278 = (OptimizeInstructions *)
                   Builder::makeUnary((Builder *)&ifTrue,ExtendUInt32,(Expression *)_auStack_6b8);
    }
    else {
      local_1278 = _auStack_6b8;
    }
    return (Expression *)local_1278;
  }
  pBStack_870 = Expression::dynCast<wasm::Binary>
                          ((Expression *)
                           ((builder.wasm)->functions).
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
  if ((pBStack_870 != (Binary *)0x0) &&
     (c_1._4_4_ = invertBinaryOp(this,pBStack_870->op), c_1._4_4_ != InvalidBinary)) {
    pEVar7 = (Expression *)
             ((builder.wasm)->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    Match::ival(&local_8c8,0);
    matcher_18._8_8_ = local_8c8._8_8_;
    matcher_18.binder = local_8c8.binder;
    matcher_18.submatchers.curr.binder = local_8c8.submatchers.curr.binder;
    matcher_18.submatchers.curr._8_8_ = local_8c8.submatchers.curr._8_8_;
    matcher_18.submatchers.curr.submatchers.curr.binder =
         local_8c8.submatchers.curr.submatchers.curr.binder;
    matcher_18.submatchers.curr.submatchers.curr.data =
         local_8c8.submatchers.curr.submatchers.curr.data;
    matcher_18.submatchers.curr.submatchers.curr._16_8_ =
         local_8c8.submatchers.curr.submatchers.curr._16_8_;
    matcher_18.submatchers.curr.submatchers._24_8_ = local_8c8.submatchers.curr.submatchers._24_8_;
    matcher_18.submatchers._48_8_ = local_8c8.submatchers._48_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                      (pEVar7,matcher_18);
    if (bVar2) {
      pEVar7 = (Expression *)
               ((builder.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Match::ival(&local_910,0);
      matcher_19._8_8_ = local_910._8_8_;
      matcher_19.binder = local_910.binder;
      matcher_19.submatchers.curr.binder = local_910.submatchers.curr.binder;
      matcher_19.submatchers.curr._8_8_ = local_910.submatchers.curr._8_8_;
      matcher_19.submatchers.curr.submatchers.curr.binder =
           local_910.submatchers.curr.submatchers.curr.binder;
      matcher_19.submatchers.curr.submatchers.curr.data =
           local_910.submatchers.curr.submatchers.curr.data;
      matcher_19.submatchers.curr.submatchers.curr._16_8_ =
           local_910.submatchers.curr.submatchers.curr._16_8_;
      matcher_19.submatchers.curr.submatchers._24_8_ = local_910.submatchers.curr.submatchers._24_8_
      ;
      matcher_19.submatchers._48_8_ = local_910.submatchers._48_8_;
      bVar2 = Match::
              matches<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
                        (pEVar7,matcher_19);
      if (bVar2) goto LAB_01900dfb;
LAB_01900ece:
      pBStack_870->op = c_1._4_4_;
      std::swap<wasm::Expression*>
                ((Expression **)
                 &((builder.wasm)->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (Expression **)&(builder.wasm)->functions);
    }
    else {
LAB_01900dfb:
      pEVar7 = (Expression *)
               ((builder.wasm)->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      Match::ival();
      matcher_16._8_8_ = uStack_948;
      matcher_16.binder = (matched_t<wasm::Const_*> *)local_950;
      matcher_16.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)local_940;
      matcher_16.submatchers.curr._8_8_ = uStack_938;
      matcher_16.submatchers.curr.submatchers.curr.binder =
           (matched_t<wasm::Match::Internal::AnyKind<long>_> *)local_930;
      matcher_16.submatchers.curr.submatchers.curr._8_8_ = uStack_928;
      matcher_16.submatchers.curr.submatchers._16_8_ = local_920;
      matcher_16.submatchers._40_8_ = uStack_918;
      bVar2 = Match::
              matches<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                        (pEVar7,matcher_16);
      if (!bVar2) {
        pEVar7 = (Expression *)
                 ((builder.wasm)->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        Match::ival(&local_990,&local_880);
        matcher_17._8_8_ = local_990._8_8_;
        matcher_17.binder = local_990.binder;
        matcher_17.submatchers.curr.binder = local_990.submatchers.curr.binder;
        matcher_17.submatchers.curr._8_8_ = local_990.submatchers.curr._8_8_;
        matcher_17.submatchers.curr.submatchers.curr.binder =
             local_990.submatchers.curr.submatchers.curr.binder;
        matcher_17.submatchers.curr.submatchers.curr._8_8_ =
             local_990.submatchers.curr.submatchers.curr._8_8_;
        matcher_17.submatchers.curr.submatchers._16_8_ =
             local_990.submatchers.curr.submatchers._16_8_;
        matcher_17.submatchers._40_8_ = local_990.submatchers._40_8_;
        bVar2 = Match::
                matches<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
                          (pEVar7,matcher_17);
        if ((bVar2) && (bVar2 = wasm::Literal::isZero(&local_880->value), !bVar2))
        goto LAB_01900ece;
      }
    }
  }
  x_1._4_4_ = 2;
  pOVar10 = (OptimizeInstructions *)((long)&x_1 + 4);
  bVar3 = wasm::Type::operator==
                    ((Type *)&((builder.wasm)->exports).
                              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,(BasicType *)pOVar10);
  bVar2 = false;
  if (bVar3) {
    pOVar10 = this;
    IVar4 = Bits::getMaxBits<wasm::OptimizeInstructions>
                      ((Expression *)
                       ((builder.wasm)->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,this);
    bVar2 = false;
    if (IVar4 < 2) {
      pOVar10 = this;
      IVar4 = Bits::getMaxBits<wasm::OptimizeInstructions>
                        ((Expression *)
                         ((builder.wasm)->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
      bVar2 = false;
      if (IVar4 < 2) {
        pOVar10 = this;
        IVar4 = Bits::getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)
                           ((builder.wasm)->functions).
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,this);
        bVar2 = IVar4 < 2;
      }
    }
  }
  BVar1.wasm = builder.wasm;
  if (bVar2) {
    local_9e8[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                              local_9a8,(Expression **)pOVar10);
    ppEVar16 = (Expression **)0x0;
    Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                 *)(local_a40 + 0x10),0);
    local_a40._0_8_ =
         Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y_1,ppEVar16);
    Match::
    select<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
              (&local_9d8,(Match *)local_9e8,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)(local_a40 + 0x10),
               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                *)local_a40,(Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)in_R8);
    matcher_10._8_8_ = local_9d8._8_8_;
    matcher_10.binder = local_9d8.binder;
    matcher_10.submatchers.curr = local_9d8.submatchers.curr;
    matcher_10.submatchers.next.curr = local_9d8.submatchers.next.curr;
    matcher_10.submatchers.next.next.curr = local_9d8.submatchers.next.next.curr;
    matcher_10.submatchers.next.next._8_8_ = local_9d8.submatchers.next.next._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                      ((Expression *)BVar1.wasm,matcher_10);
    BVar1 = builder;
    if (bVar2) {
      pOVar10 = (OptimizeInstructions *)
                Builder::makeBinary((Builder *)&ifTrue,AndInt32,(Expression *)local_9a8,y_1);
      return (Expression *)pOVar10;
    }
    ppEVar16 = (Expression **)0x1;
    Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                 *)(local_ac8 + 0x10),1);
    local_ac8._0_8_ =
         Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_9a8,
                    ppEVar16);
    bin = (Binary *)
          Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&y_1,ppEVar16);
    Match::
    select<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
              (&local_a70,(Match *)(local_ac8 + 0x10),
               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                *)local_ac8,(Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&bin,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)in_R8);
    matcher_11._8_8_ = local_a70._8_8_;
    matcher_11.binder = local_a70.binder;
    matcher_11.submatchers.curr = local_a70.submatchers.curr;
    matcher_11.submatchers.next.curr = local_a70.submatchers.next.curr;
    matcher_11.submatchers.next.next.curr = local_a70.submatchers.next.next.curr;
    matcher_11.submatchers.next.next._8_8_ = local_a70.submatchers.next.next._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                      ((Expression *)BVar1.wasm,matcher_11);
    if (bVar2) {
      pOVar10 = (OptimizeInstructions *)
                Builder::makeBinary((Builder *)&ifTrue,OrInt32,(Expression *)local_9a8,y_1);
      return (Expression *)pOVar10;
    }
  }
  BVar1.wasm = builder.wasm;
  Match::ival(&local_b58,-1);
  Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
               *)(local_bc8 + 0x28),1);
  local_bd8[0] = Match::any();
  Match::ival(&local_c20,0);
  pMVar14 = &local_c20;
  Match::
  binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
            ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
              *)local_bc8,(Match *)&local_ae0,(Binary **)0x16,(Op)local_bd8,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar14,in_R9);
  this_00 = &local_b58;
  s2_00 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
           *)local_bc8;
  Match::
  select<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
            (&local_b10,(Match *)this_00,
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              *)(local_bc8 + 0x28),s2_00,
             (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
              *)pMVar14);
  matcher_12._8_8_ = local_b10._8_8_;
  matcher_12.binder = local_b10.binder;
  matcher_12.submatchers.curr = local_b10.submatchers.curr;
  matcher_12.submatchers.next.curr = local_b10.submatchers.next.curr;
  matcher_12.submatchers.next.next.curr = local_b10.submatchers.next.next.curr;
  matcher_12.submatchers.next.next._8_8_ = local_b10.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>&>>
                    ((Expression *)BVar1.wasm,matcher_12);
  BVar1 = builder;
  pMVar14 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
             *)CONCAT71((int7)((ulong)s2_00 >> 8),bVar2);
  local_12b1 = true;
  if (!bVar2) {
    Match::ival(&local_c98,1);
    Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                 *)(local_d08 + 0x28),-1);
    local_d18[0] = Match::any();
    Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                 *)&c_2,0);
    s3 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          *)&c_2;
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>>
              ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                *)local_d08,(Match *)&local_ae0,(Binary **)0x1c,(Op)local_d18,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)s3,in_R9);
    this_00 = &local_c98;
    pMVar14 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
               *)local_d08;
    Match::
    select<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>>
              (&local_c50,(Match *)this_00,
               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                *)(local_d08 + 0x28),pMVar14,s3);
    matcher_13._8_8_ = local_c50._8_8_;
    matcher_13.binder = local_c50.binder;
    matcher_13.submatchers.curr = local_c50.submatchers.curr;
    matcher_13.submatchers.next.curr = local_c50.submatchers.next.curr;
    matcher_13.submatchers.next.next.curr = local_c50.submatchers.next.next.curr;
    matcher_13.submatchers.next.next._8_8_ = local_c50.submatchers.next.next._8_8_;
    local_12b1 = Match::
                 matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>>>>&>&>>
                           ((Expression *)BVar1.wasm,matcher_13);
  }
  if (local_12b1 != false) {
    type.id = (uintptr_t)Expression::cast<wasm::Const>(*(Expression **)(local_ae0 + 2));
    local_d70._M_head_impl =
         ((builder.wasm)->exports).
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage[1]._M_t.
         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    this_00 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
               *)&(((Const *)type.id)->super_SpecificExpression<(wasm::Expression::Id)14>).
                  super_Expression.type;
    bVar2 = wasm::Type::operator==((Type *)&local_d70,(Type *)this_00);
    if (bVar2) {
      (local_ae0->type).id = (uintptr_t)local_d70._M_head_impl;
      local_d78 = local_d70._M_head_impl;
      IVar5 = Abstract::getBinary((Type)local_d70._M_head_impl,ShrS);
      local_ae0[1]._id = IVar5;
      uVar6 = wasm::Type::getByteSize((Type *)&local_d70);
      local_d98 = local_d70._M_head_impl;
      wasm::Literal::makeFromInt32(&local_d90,uVar6 * 8 + -1,(Type)local_d70._M_head_impl);
      wasm::Literal::operator=((Literal *)(type.id + 0x10),&local_d90);
      wasm::Literal::~Literal(&local_d90);
      local_dc8 = local_d70._M_head_impl;
      wasm::Literal::makeOne(&local_dc0,(Type)local_d70._M_head_impl);
      pCVar9 = Expression::cast<wasm::Const>
                         ((Expression *)
                          ((builder.wasm)->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      wasm::Literal::operator=(&pCVar9->value,&local_dc0);
      wasm::Literal::~Literal(&local_dc0);
      s = (Select *)local_d70._M_head_impl;
      op = Abstract::getBinary((Type)local_d70._M_head_impl,Or);
      pOVar10 = (OptimizeInstructions *)
                Builder::makeBinary((Builder *)&ifTrue,op,local_ae0,
                                    (Expression *)
                                    ((builder.wasm)->exports).
                                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return (Expression *)pOVar10;
    }
  }
  BVar1.wasm = builder.wasm;
  local_e30[0] = (Select *)
                 Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                            &ifFalse_1,(Expression **)this_00);
  local_e40.binder =
       (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
       Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&c_3,
                  (Expression **)this_00);
  ifTrue_2 = (Expression *)
             Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_df0,
                        (Expression **)this_00);
  Match::unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
            (&local_e60,(Match *)0x14,(UnaryOp)&ifTrue_2,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar14);
  pEVar7 = (Expression *)&ifTrue_1;
  pMVar13 = &local_e60;
  Match::
  select<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
            (&local_e20,(Match *)pEVar7,local_e30,&local_e40,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar13,
             (Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
              *)in_R9);
  matcher_14._8_8_ = local_e20._8_8_;
  matcher_14.binder = local_e20.binder;
  matcher_14.submatchers.curr = local_e20.submatchers.curr;
  matcher_14.submatchers.next.curr = local_e20.submatchers.next.curr;
  matcher_14.submatchers.next.next.curr = local_e20.submatchers.next.next.curr;
  matcher_14.submatchers.next.next._8_8_ = local_e20.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&>>
                    ((Expression *)BVar1.wasm,matcher_14);
  local_12d9 = false;
  if (bVar2) {
    pEVar7 = ifFalse_1;
    local_12d9 = canReorder(this,ifFalse_1,c_3);
  }
  BVar1.wasm = builder.wasm;
  if (local_12d9 != false) {
    *(Expression **)(ifTrue_1 + 1) = c_3;
    ifTrue_1[1].type.id = (uintptr_t)ifFalse_1;
    *(undefined1 (*) [8])(ifTrue_1 + 2) = local_df0;
    return ifTrue_1;
  }
  local_ec8[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                            &ifFalse_2,(Expression **)pEVar7);
  local_ed8.binder =
       (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
       Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&c_4,
                  (Expression **)pEVar7);
  value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_e88,
                          (Expression **)pEVar7);
  Match::
  select<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
            (&local_eb8,(Match *)local_ec8,&local_ed8,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
             &value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)pMVar13);
  matcher_15._8_8_ = local_eb8._8_8_;
  matcher_15.binder = local_eb8.binder;
  matcher_15.submatchers.curr = local_eb8.submatchers.curr;
  matcher_15.submatchers.next.curr = local_eb8.submatchers.next.curr;
  matcher_15.submatchers.next.next.curr = local_eb8.submatchers.next.next.curr;
  matcher_15.submatchers.next.next._8_8_ = local_eb8.submatchers.next.next._8_8_;
  bVar2 = Match::
          matches<wasm::Match::Internal::Matcher<wasm::Select*,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                    ((Expression *)BVar1.wasm,matcher_15);
  local_12e9 = false;
  if (bVar2) {
    local_12e9 = ExpressionAnalyzer::equal(ifFalse_2,c_4);
  }
  if (local_12e9 == false) {
    return (Expression *)(OptimizeInstructions *)0x0;
  }
  __return_storage_ptr__ =
       &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  effects((EffectAnalyzer *)__return_storage_ptr__,this,ifFalse_2);
  bVar2 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)__return_storage_ptr__);
  if (!bVar2) {
    effects((EffectAnalyzer *)local_11c8,this,(Expression *)local_e88);
    bVar2 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_11c8);
    if (bVar2) {
      bVar2 = EffectAnalyzer::invalidates
                        ((EffectAnalyzer *)local_11c8,
                         (EffectAnalyzer *)
                         &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                        );
      if (bVar2) {
        bVar2 = false;
      }
      else {
        pDVar11 = Builder::makeDrop((Builder *)&ifTrue,(Expression *)local_e88);
        this_local = (OptimizeInstructions *)
                     Builder::makeSequence((Builder *)&ifTrue,(Expression *)pDVar11,ifFalse_2);
        bVar2 = true;
      }
    }
    else {
      this_local = (OptimizeInstructions *)ifFalse_2;
      bVar2 = true;
    }
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_11c8);
    if (bVar2) goto LAB_01901807;
  }
  bVar2 = false;
LAB_01901807:
  EffectAnalyzer::~EffectAnalyzer
            ((EffectAnalyzer *)
             &condition.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (!bVar2) {
    return (Expression *)(OptimizeInstructions *)0x0;
  }
  return (Expression *)this_local;
}

Assistant:

Expression* optimizeSelect(Select* curr) {
    using namespace Match;
    using namespace Abstract;
    Builder builder(*getModule());
    curr->condition = optimizeBoolean(curr->condition);
    {
      // Constant condition, we can just pick the correct side (barring side
      // effects)
      Expression *ifTrue, *ifFalse;
      if (matches(curr, select(pure(&ifTrue), any(&ifFalse), i32(0)))) {
        return ifFalse;
      }
      if (matches(curr, select(any(&ifTrue), any(&ifFalse), i32(0)))) {
        return builder.makeSequence(builder.makeDrop(ifTrue), ifFalse);
      }
      int32_t cond;
      if (matches(curr, select(any(&ifTrue), pure(&ifFalse), i32(&cond)))) {
        // The condition must be non-zero because a zero would have matched one
        // of the previous patterns.
        assert(cond != 0);
        return ifTrue;
      }
      // Don't bother when `ifFalse` isn't pure - we would need to reverse the
      // order using a temp local, which would be bad
    }
    {
      // TODO: Remove this after landing SCCP pass. See: #4161

      // i32(x) ? i32(x) : 0  ==>  x
      Expression *x, *y;
      if (matches(curr, select(any(&x), i32(0), any(&y))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return curr->ifTrue;
      }
      // i32(x) ? 0 : i32(x)  ==>  { x, 0 }
      if (matches(curr, select(i32(0), any(&x), any(&y))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return builder.makeSequence(builder.makeDrop(x), curr->ifTrue);
      }

      // i64(x) == 0 ? 0 : i64(x)  ==>  x
      // i64(x) != 0 ? i64(x) : 0  ==>  x
      if ((matches(curr, select(i64(0), any(&x), unary(EqZInt64, any(&y)))) ||
           matches(
             curr,
             select(any(&x), i64(0), binary(NeInt64, any(&y), i64(0))))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return curr->condition->is<Unary>() ? curr->ifFalse : curr->ifTrue;
      }

      // i64(x) == 0 ? i64(x) : 0  ==>  { x, 0 }
      // i64(x) != 0 ? 0 : i64(x)  ==>  { x, 0 }
      if ((matches(curr, select(any(&x), i64(0), unary(EqZInt64, any(&y)))) ||
           matches(
             curr,
             select(i64(0), any(&x), binary(NeInt64, any(&y), i64(0))))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return builder.makeSequence(
          builder.makeDrop(x),
          curr->condition->is<Unary>() ? curr->ifFalse : curr->ifTrue);
      }
    }
    {
      // Simplify selects between 0 and 1
      Expression* c;
      bool reversed = matches(curr, select(ival(0), ival(1), any(&c)));
      if (reversed || matches(curr, select(ival(1), ival(0), any(&c)))) {
        if (reversed) {
          c = optimizeBoolean(builder.makeUnary(EqZInt32, c));
        }
        if (!Properties::emitsBoolean(c)) {
          // cond ? 1 : 0 ==> !!cond
          c = builder.makeUnary(EqZInt32, builder.makeUnary(EqZInt32, c));
        }
        return curr->type == Type::i64 ? builder.makeUnary(ExtendUInt32, c) : c;
      }
    }
    // Flip the arms if doing so might help later optimizations here.
    if (auto* binary = curr->condition->dynCast<Binary>()) {
      auto inv = invertBinaryOp(binary->op);
      if (inv != InvalidBinary) {
        // For invertible binary operations, we prefer to have non-zero values
        // in the ifTrue, and zero values in the ifFalse, due to the
        // optimization right after us. Even if this does not help there, it is
        // a nice canonicalization. (To ensure convergence - that we don't keep
        // doing work each time we get here - do nothing if both are zero, or
        // if both are nonzero.)
        Const* c;
        if ((matches(curr->ifTrue, ival(0)) &&
             !matches(curr->ifFalse, ival(0))) ||
            (!matches(curr->ifTrue, ival()) &&
             matches(curr->ifFalse, ival(&c)) && !c->value.isZero())) {
          binary->op = inv;
          std::swap(curr->ifTrue, curr->ifFalse);
        }
      }
    }
    if (curr->type == Type::i32 &&
        Bits::getMaxBits(curr->condition, this) <= 1 &&
        Bits::getMaxBits(curr->ifTrue, this) <= 1 &&
        Bits::getMaxBits(curr->ifFalse, this) <= 1) {
      // The condition and both arms are i32 booleans, which allows us to do
      // boolean optimizations.
      Expression* x;
      Expression* y;

      // x ? y : 0   ==>   x & y
      if (matches(curr, select(any(&y), ival(0), any(&x)))) {
        return builder.makeBinary(AndInt32, y, x);
      }

      // x ? 1 : y   ==>   x | y
      if (matches(curr, select(ival(1), any(&y), any(&x)))) {
        return builder.makeBinary(OrInt32, y, x);
      }
    }
    {
      // Simplify x < 0 ? -1 : 1 or x >= 0 ? 1 : -1 to
      // i32(x) >> 31 | 1
      // i64(x) >> 63 | 1
      Binary* bin;
      if (matches(
            curr,
            select(ival(-1), ival(1), binary(&bin, LtS, any(), ival(0)))) ||
          matches(
            curr,
            select(ival(1), ival(-1), binary(&bin, GeS, any(), ival(0))))) {
        auto c = bin->right->cast<Const>();
        auto type = curr->ifTrue->type;
        if (type == c->type) {
          bin->type = type;
          bin->op = Abstract::getBinary(type, ShrS);
          c->value = Literal::makeFromInt32(type.getByteSize() * 8 - 1, type);
          curr->ifTrue->cast<Const>()->value = Literal::makeOne(type);
          return builder.makeBinary(
            Abstract::getBinary(type, Or), bin, curr->ifTrue);
        }
      }
    }
    {
      // Flip select to remove eqz if we can reorder
      Select* s;
      Expression *ifTrue, *ifFalse, *c;
      if (matches(
            curr,
            select(
              &s, any(&ifTrue), any(&ifFalse), unary(EqZInt32, any(&c)))) &&
          canReorder(ifTrue, ifFalse)) {
        s->ifTrue = ifFalse;
        s->ifFalse = ifTrue;
        s->condition = c;
        return s;
      }
    }
    {
      // Sides are identical, fold
      Expression *ifTrue, *ifFalse, *c;
      if (matches(curr, select(any(&ifTrue), any(&ifFalse), any(&c))) &&
          ExpressionAnalyzer::equal(ifTrue, ifFalse)) {
        auto value = effects(ifTrue);
        if (value.hasSideEffects()) {
          // At best we don't need the condition, but need to execute the
          // value twice. a block is larger than a select by 2 bytes, and we
          // must drop one value, so 3, while we save the condition, so it's
          // not clear this is worth it, TODO
        } else {
          // The value has no side effects, so we can replace ourselves with one
          // of the two identical values in the arms.
          auto condition = effects(c);
          if (!condition.hasSideEffects()) {
            return ifTrue;
          } else {
            // The condition is last, so we need a new local, and it may be a
            // bad idea to use a block like we do for an if. Do it only if we
            // can reorder
            if (!condition.invalidates(value)) {
              return builder.makeSequence(builder.makeDrop(c), ifTrue);
            }
          }
        }
      }
    }
    return nullptr;
  }